

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int SUNClassicalGS(N_Vector *v,realtype **h,int k,int p,realtype *new_vk_norm,realtype *stemp,
                  N_Vector *vtemp)

{
  long lVar1;
  int iVar2;
  int nvec;
  int iVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double *in_R8;
  undefined8 *in_R9;
  realtype rVar4;
  undefined8 *in_stack_00000008;
  realtype vk_norm;
  int retval;
  int k_minus_1;
  int i0;
  int i;
  N_Vector in_stack_ffffffffffffff98;
  double dVar5;
  N_Vector in_stack_ffffffffffffffa0;
  N_Vector x;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector c;
  N_Vector x_00;
  int nvec_00;
  int local_34;
  int local_4;
  
  iVar2 = in_EDX + -1;
  if (in_EDX - in_ECX < 1) {
    nvec = 0;
  }
  else {
    nvec = in_EDX - in_ECX;
  }
  nvec_00 = nvec;
  iVar3 = N_VDotProdMulti(nvec,in_stack_ffffffffffffffa8,(N_Vector *)in_stack_ffffffffffffffa0,
                          (realtype *)in_stack_ffffffffffffff98);
  if (iVar3 == 0) {
    if (0.0 < (double)in_R9[in_EDX - nvec]) {
      c = (N_Vector)sqrt((double)in_R9[in_EDX - nvec]);
    }
    else {
      c = (N_Vector)0x0;
    }
    iVar3 = in_EDX - nvec;
    while (local_34 = iVar3 + -1, -1 < local_34) {
      *(undefined8 *)(*(long *)(in_RSI + (long)local_34 * 8) + (long)iVar2 * 8) = in_R9[local_34];
      in_R9[iVar3] = in_R9[local_34] ^ 0x8000000000000000;
      in_stack_00000008[iVar3] = *(undefined8 *)(in_RDI + (long)local_34 * 8);
      iVar3 = local_34;
    }
    *in_R9 = 0x3ff0000000000000;
    *in_stack_00000008 = *(undefined8 *)(in_RDI + (long)in_EDX * 8);
    x_00 = c;
    iVar3 = N_VLinearCombination
                      (nvec_00,(realtype *)c,(N_Vector *)in_stack_ffffffffffffffa0,
                       in_stack_ffffffffffffff98);
    if (iVar3 == 0) {
      rVar4 = N_VDotProd(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (0.0 < rVar4) {
        rVar4 = N_VDotProd(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        x = (N_Vector)sqrt(rVar4);
      }
      else {
        x = (N_Vector)0x0;
      }
      *in_R8 = (double)x;
      if (*in_R8 * 1000.0 < (double)c) {
        iVar3 = N_VDotProdMulti(nvec_00,x_00,(N_Vector *)x,(realtype *)in_stack_ffffffffffffff98);
        if (iVar3 != 0) {
          return -1;
        }
        *in_R9 = 0x3ff0000000000000;
        *in_stack_00000008 = *(undefined8 *)(in_RDI + (long)in_EDX * 8);
        for (local_34 = nvec; local_34 < in_EDX; local_34 = local_34 + 1) {
          lVar1 = *(long *)(in_RSI + (long)local_34 * 8);
          *(double *)(lVar1 + (long)iVar2 * 8) =
               (double)in_R9[(local_34 - nvec) + 1] + *(double *)(lVar1 + (long)iVar2 * 8);
          in_R9[(local_34 - nvec) + 1] = in_R9[(local_34 - nvec) + 1] ^ 0x8000000000000000;
          in_stack_00000008[(local_34 - nvec) + 1] =
               *(undefined8 *)(in_RDI + (long)(local_34 - nvec) * 8);
        }
        iVar2 = N_VLinearCombination
                          (nvec_00,(realtype *)x_00,(N_Vector *)x,in_stack_ffffffffffffff98);
        if (iVar2 != 0) {
          return -1;
        }
        rVar4 = N_VDotProd(x,in_stack_ffffffffffffff98);
        if (0.0 < rVar4) {
          rVar4 = N_VDotProd(x,in_stack_ffffffffffffff98);
          dVar5 = sqrt(rVar4);
        }
        else {
          dVar5 = 0.0;
        }
        *in_R8 = dVar5;
      }
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int SUNClassicalGS(N_Vector *v, realtype **h, int k, int p, realtype *new_vk_norm,
                   realtype *stemp, N_Vector *vtemp)
{
  int  i, i0, k_minus_1, retval;
  realtype vk_norm;

  k_minus_1 = k - 1;
  i0 = SUNMAX(k-p,0);

  /* Perform Classical Gram-Schmidt */

  retval = N_VDotProdMulti(k-i0+1, v[k], v+i0, stemp);
  if (retval != 0) return(-1);

  vk_norm = SUNRsqrt(stemp[k-i0]);
  for (i=k-i0-1; i >= 0; i--) {
    h[i][k_minus_1] = stemp[i];
    stemp[i+1] = -stemp[i];
    vtemp[i+1] = v[i];
  }
  stemp[0] = ONE;
  vtemp[0] = v[k];

  retval = N_VLinearCombination(k-i0+1, stemp, vtemp, v[k]);
  if (retval != 0) return(-1);

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));

  /* Reorthogonalize if necessary */

  if ((FACTOR * (*new_vk_norm)) < vk_norm) {

    retval = N_VDotProdMulti(k-i0, v[k], v+i0, stemp+1);
    if (retval != 0) return(-1);

    stemp[0] = ONE;
    vtemp[0] = v[k];
    for (i=i0; i < k; i++) {
      h[i][k_minus_1] += stemp[i-i0+1];
      stemp[i-i0+1] = -stemp[i-i0+1];
      vtemp[i-i0+1] = v[i-i0];
    }

    retval = N_VLinearCombination(k+1, stemp, vtemp, v[k]);
    if (retval != 0) return(-1);

    *new_vk_norm = SUNRsqrt(N_VDotProd(v[k],v[k]));
  }

  return(0);
}